

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteQuotedData(WatWriter *this,void *data,size_t length)

{
  byte c;
  size_t i;
  size_t sVar1;
  
  WriteNextChar(this);
  WritePutc(this,'\"');
  for (sVar1 = 0; length != sVar1; sVar1 = sVar1 + 1) {
    c = *(byte *)((long)data + sVar1);
    if ((anonymous_namespace)::s_is_char_escaped[c] != '\0') {
      WritePutc(this,'\\');
      WritePutc(this,"0123456789abcdef"[c >> 4]);
      c = "0123456789abcdef"[c & 0xf];
    }
    WritePutc(this,c);
  }
  WritePutc(this,'\"');
  this->next_char_ = Space;
  return;
}

Assistant:

void WatWriter::WriteQuotedData(const void* data, size_t length) {
  const uint8_t* u8_data = static_cast<const uint8_t*>(data);
  static const char s_hexdigits[] = "0123456789abcdef";
  WriteNextChar();
  WritePutc('\"');
  for (size_t i = 0; i < length; ++i) {
    uint8_t c = u8_data[i];
    if (s_is_char_escaped[c]) {
      WritePutc('\\');
      WritePutc(s_hexdigits[c >> 4]);
      WritePutc(s_hexdigits[c & 0xf]);
    } else {
      WritePutc(c);
    }
  }
  WritePutc('\"');
  next_char_ = NextChar::Space;
}